

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined1 *puVar2;
  NotSupportedError *this_01;
  int row;
  long lVar3;
  Matrix<float,_4,_4> *pMVar4;
  long lVar5;
  EVP_PKEY_CTX *ctx_00;
  EVP_PKEY_CTX *pEVar6;
  Matrix<float,_4,_4> *pMVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int numVertexUnits;
  float lodCoordTrans [16];
  Matrix<float,_4,_4> local_a8;
  undefined1 local_68 [4];
  float fStack_64;
  undefined4 uStack_60;
  float fStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  long lStack_40;
  undefined8 local_38;
  long lStack_30;
  
  pMVar4 = &local_a8;
  ctx_00 = (EVP_PKEY_CTX *)&local_a8;
  pMVar7 = &local_a8;
  pEVar6 = (EVP_PKEY_CTX *)&local_a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
    local_a8.m_data.m_data[0].m_data._0_8_ =
         (ulong)(uint)local_a8.m_data.m_data[0].m_data[1] << 0x20;
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8b4c);
    if ((int)local_a8.m_data.m_data[0].m_data[0] < 1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      _local_68 = (pointer)&local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Vertex shader texture access is not supported","");
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_68);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  fVar8 = (this->m_lookupSpec).maxCoord.m_data[2] - (this->m_lookupSpec).minCoord.m_data[2];
  fVar9 = (this->m_lookupSpec).maxCoord.m_data[3] - (this->m_lookupSpec).minCoord.m_data[3];
  fVar10 = fVar8 * 0.5;
  fVar11 = fVar9 * 0.5;
  puVar2 = local_68;
  local_68 = (undefined1  [4])
             ((this->m_lookupSpec).maxCoord.m_data[0] - (this->m_lookupSpec).minCoord.m_data[0]);
  fStack_64 = 0.0;
  uStack_60 = 0;
  fStack_5c = (this->m_lookupSpec).minCoord.m_data[0];
  lVar3 = 0;
  local_58._M_allocated_capacity =
       (ulong)(uint)((this->m_lookupSpec).maxCoord.m_data[1] -
                    (this->m_lookupSpec).minCoord.m_data[1]) << 0x20;
  local_58._8_8_ = (ulong)(uint)(this->m_lookupSpec).minCoord.m_data[1] << 0x20;
  local_48 = CONCAT44(fVar8 * -0.5,fVar10);
  lStack_40 = (ulong)(uint)((this->m_lookupSpec).minCoord.m_data[2] + fVar10) << 0x20;
  local_38 = CONCAT44(fVar11,fVar9 * -0.5);
  lStack_30 = (ulong)(uint)(fVar11 + (this->m_lookupSpec).minCoord.m_data[3]) << 0x20;
  local_a8.m_data.m_data[3].m_data[0] = 0.0;
  local_a8.m_data.m_data[3].m_data[1] = 0.0;
  local_a8.m_data.m_data[3].m_data[2] = 0.0;
  local_a8.m_data.m_data[3].m_data[3] = 0.0;
  local_a8.m_data.m_data[2].m_data[0] = 0.0;
  local_a8.m_data.m_data[2].m_data[1] = 0.0;
  local_a8.m_data.m_data[2].m_data[2] = 0.0;
  local_a8.m_data.m_data[2].m_data[3] = 0.0;
  local_a8.m_data.m_data[1].m_data[0] = 0.0;
  local_a8.m_data.m_data[1].m_data[1] = 0.0;
  local_a8.m_data.m_data[1].m_data[2] = 0.0;
  local_a8.m_data.m_data[1].m_data[3] = 0.0;
  local_a8.m_data.m_data[0].m_data[0] = 0.0;
  local_a8.m_data.m_data[0].m_data[1] = 0.0;
  local_a8.m_data.m_data[0].m_data[2] = 0.0;
  local_a8.m_data.m_data[0].m_data[3] = 0.0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pMVar4 + lVar5 * 4) = *(undefined4 *)(puVar2 + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar3 = lVar3 + 1;
    pMVar4 = (Matrix<float,_4,_4> *)((long)pMVar4 + 4);
    puVar2 = puVar2 + 0x10;
  } while (lVar3 != 4);
  this_00 = &(this->super_ShaderRenderCase).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             &local_a8);
  if (((this->m_lookupSpec).function - FUNCTION_TEXTURELOD < 3) ||
     ((this->m_lookupSpec).useBias == true)) {
    fStack_5c = (this->m_lookupSpec).minLodBias;
    puVar2 = local_68;
    uStack_60 = 0;
    local_38 = 0;
    lStack_30 = 0;
    local_48 = 0;
    lStack_40 = 0;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68 = (undefined1  [4])(((this->m_lookupSpec).maxLodBias - fStack_5c) * 0.5);
    fStack_64 = (float)local_68;
    local_a8.m_data.m_data[3].m_data[0] = 0.0;
    local_a8.m_data.m_data[3].m_data[1] = 0.0;
    local_a8.m_data.m_data[3].m_data[2] = 0.0;
    local_a8.m_data.m_data[3].m_data[3] = 0.0;
    local_a8.m_data.m_data[2].m_data[0] = 0.0;
    local_a8.m_data.m_data[2].m_data[1] = 0.0;
    local_a8.m_data.m_data[2].m_data[2] = 0.0;
    local_a8.m_data.m_data[2].m_data[3] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[3] = 0.0;
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[0].m_data[3] = 0.0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)pMVar7 + lVar5 * 4) = *(undefined4 *)(puVar2 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pMVar7 = (Matrix<float,_4,_4> *)((long)pMVar7 + 4);
      puVar2 = puVar2 + 0x10;
    } while (lVar3 != 4);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               &local_a8);
    ctx_00 = pEVar6;
  }
  initShaderSources(this);
  initTexture(this);
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar1;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	if (m_isVertexCase)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();
		int numVertexUnits = 0;
		gl.getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numVertexUnits);
		if (numVertexUnits < 1)
			throw tcu::NotSupportedError("Vertex shader texture access is not supported");
	}

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	if (functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}